

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber.cc
# Opt level: O1

int cbs_find_ber(CBS *orig_in,int *ber_found,uint32_t depth)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CBS_ASN1_TAG tag;
  size_t header_len;
  int indefinite;
  CBS in;
  CBS contents;
  uint local_6c;
  size_t local_68;
  int local_5c;
  CBS local_58;
  CBS local_40;
  
  iVar3 = 0;
  if (depth < 0x81) {
    local_58.data = orig_in->data;
    local_58.len = orig_in->len;
    *ber_found = 0;
    do {
      if (local_58.len == 0) {
        return 1;
      }
      iVar2 = CBS_get_any_ber_asn1_element
                        (&local_58,&local_40,&local_6c,&local_68,ber_found,&local_5c);
      if (iVar2 == 0) {
LAB_00316ea1:
        iVar3 = 0;
        bVar1 = false;
      }
      else {
        if (*ber_found == 0) {
          if ((local_6c >> 0x1d & 1) == 0) {
LAB_00316e4c:
            bVar1 = true;
            goto LAB_00316ea6;
          }
          if (((local_6c & 0xdfffffff) < 0x1f) && ((0x5e7c1010U >> (local_6c & 0x1f) & 1) != 0)) {
            *ber_found = 1;
          }
          else {
            iVar2 = CBS_skip(&local_40,local_68);
            if ((iVar2 == 0) || (iVar2 = cbs_find_ber(&local_40,ber_found,depth + 1), iVar2 == 0))
            goto LAB_00316ea1;
            if (*ber_found == 0) goto LAB_00316e4c;
          }
        }
        bVar1 = false;
        iVar3 = 1;
      }
LAB_00316ea6:
    } while (bVar1);
  }
  return iVar3;
}

Assistant:

static int cbs_find_ber(const CBS *orig_in, int *ber_found, uint32_t depth) {
  if (depth > kMaxDepth) {
    return 0;
  }

  CBS in = *orig_in;
  *ber_found = 0;

  while (CBS_len(&in) > 0) {
    CBS contents;
    CBS_ASN1_TAG tag;
    size_t header_len;
    int indefinite;
    if (!CBS_get_any_ber_asn1_element(&in, &contents, &tag, &header_len,
                                      ber_found, &indefinite)) {
      return 0;
    }
    if (*ber_found) {
      return 1;
    }
    if (tag & CBS_ASN1_CONSTRUCTED) {
      if (is_string_type(tag)) {
        // Constructed strings are only legal in BER and require conversion.
        *ber_found = 1;
        return 1;
      }
      if (!CBS_skip(&contents, header_len) ||
          !cbs_find_ber(&contents, ber_found, depth + 1)) {
        return 0;
      }
      if (*ber_found) {
        // We already found BER. No need to continue parsing.
        return 1;
      }
    }
  }

  return 1;
}